

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_get_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  Curl_easy *data;
  void *pvVar1;
  CURLcode CVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  byte *pbVar7;
  _Bool connected;
  curl_off_t size;
  _Bool local_31;
  curl_off_t local_30;
  
  data = conn->data;
  pvVar1 = (data->req).protop;
  if ((ftpcode != 0x96) && (ftpcode != 0x7d)) {
    if (ftpcode == 0x1c2 && instate == FTP_LIST) {
      *(undefined4 *)((long)pvVar1 + 0x18) = 2;
      (conn->proto).ftpc.state = FTP_STOP;
      return CURLE_OK;
    }
    Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
    if (ftpcode != 0x226 || instate != FTP_RETR) {
      return CURLE_FTP_COULDNT_RETR_FILE;
    }
    return CURLE_REMOTE_FILE_NOT_FOUND;
  }
  local_30 = -1;
  if (((instate == FTP_LIST) || ((data->set).prefer_ascii != false)) ||
     (0 < *(long *)((long)pvVar1 + 0x20))) {
    if (-1 < *(long *)((long)pvVar1 + 0x20)) {
      local_30 = *(long *)((long)pvVar1 + 0x20);
    }
  }
  else {
    pcVar6 = (data->state).buffer;
    pcVar4 = strstr(pcVar6," bytes");
    if (pcVar4 != (char *)0x0) {
      pbVar7 = (byte *)(pcVar4 + -1);
      if (pbVar7 + ~(ulong)pcVar6 != (byte *)0x0) {
        pcVar6 = pcVar6 + (2 - (long)pcVar4);
        do {
          if (*pbVar7 == 0x28) break;
          iVar3 = Curl_isdigit((uint)*pbVar7);
          if (iVar3 == 0) {
            pbVar7 = (byte *)0x0;
            break;
          }
          pbVar7 = pbVar7 + -1;
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 != (char *)0x0);
      }
      if (pbVar7 != (byte *)0x0) {
        curlx_strtoofft((char *)(pbVar7 + 1),(char **)0x0,0,&local_30);
      }
    }
  }
  lVar5 = (data->req).maxdownload;
  if (lVar5 < 1 || local_30 <= lVar5) {
    if (instate != FTP_LIST) {
      if ((data->set).prefer_ascii == true) {
        local_30 = -1;
      }
      goto LAB_00117227;
    }
    pcVar6 = "Maxdownload = %ld\n";
  }
  else {
    (data->req).size = lVar5;
    local_30 = lVar5;
LAB_00117227:
    Curl_infof(data,"Maxdownload = %ld\n",(data->req).maxdownload);
    if (instate == FTP_LIST) goto LAB_0011726c;
    pcVar6 = "Getting file with size: %ld\n";
    lVar5 = local_30;
  }
  Curl_infof(data,pcVar6,lVar5);
LAB_0011726c:
  (conn->proto).ftpc.state_saved = instate;
  (conn->proto).ftpc.retr_size_saved = local_30;
  if ((data->set).ftp_use_port == true) {
    CVar2 = AllowServerConnect(conn,&local_31);
    if ((CVar2 == CURLE_OK) && (local_31 == false)) {
      Curl_infof(data,"Data conn was not available immediately\n");
      (conn->proto).ftpc.state = FTP_STOP;
      (conn->proto).ftpc.wait_data_conn = true;
    }
  }
  else {
    CVar2 = InitiateTransfer(conn);
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_get_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;

  if((ftpcode == 150) || (ftpcode == 125)) {

    /*
      A;
      150 Opening BINARY mode data connection for /etc/passwd (2241
      bytes).  (ok, the file is being transferred)

      B:
      150 Opening ASCII mode data connection for /bin/ls

      C:
      150 ASCII data connection for /bin/ls (137.167.104.91,37445) (0 bytes).

      D:
      150 Opening ASCII mode data connection for [file] (0.0.0.0,0) (545 bytes)

      E:
      125 Data connection already open; Transfer starting. */

    curl_off_t size = -1; /* default unknown size */


    /*
     * It appears that there are FTP-servers that return size 0 for files when
     * SIZE is used on the file while being in BINARY mode. To work around
     * that (stupid) behavior, we attempt to parse the RETR response even if
     * the SIZE returned size zero.
     *
     * Debugging help from Salvatore Sorrentino on February 26, 2003.
     */

    if((instate != FTP_LIST) &&
       !data->set.prefer_ascii &&
       (ftp->downloadsize < 1)) {
      /*
       * It seems directory listings either don't show the size or very
       * often uses size 0 anyway. ASCII transfers may very well turn out
       * that the transferred amount of data is not the same as this line
       * tells, why using this number in those cases only confuses us.
       *
       * Example D above makes this parsing a little tricky */
      char *bytes;
      char *buf = data->state.buffer;
      bytes = strstr(buf, " bytes");
      if(bytes) {
        long in = (long)(--bytes-buf);
        /* this is a hint there is size information in there! ;-) */
        while(--in) {
          /* scan for the left parenthesis and break there */
          if('(' == *bytes)
            break;
          /* skip only digits */
          if(!ISDIGIT(*bytes)) {
            bytes = NULL;
            break;
          }
          /* one more estep backwards */
          bytes--;
        }
        /* if we have nothing but digits: */
        if(bytes++) {
          /* get the number! */
          (void)curlx_strtoofft(bytes, NULL, 0, &size);
        }
      }
    }
    else if(ftp->downloadsize > -1)
      size = ftp->downloadsize;

    if(size > data->req.maxdownload && data->req.maxdownload > 0)
      size = data->req.size = data->req.maxdownload;
    else if((instate != FTP_LIST) && (data->set.prefer_ascii))
      size = -1; /* kludge for servers that understate ASCII mode file size */

    infof(data, "Maxdownload = %" CURL_FORMAT_CURL_OFF_T "\n",
          data->req.maxdownload);

    if(instate != FTP_LIST)
      infof(data, "Getting file with size: %" CURL_FORMAT_CURL_OFF_T "\n",
            size);

    /* FTP download: */
    conn->proto.ftpc.state_saved = instate;
    conn->proto.ftpc.retr_size_saved = size;

    if(data->set.ftp_use_port) {
      bool connected;

      result = AllowServerConnect(conn, &connected);
      if(result)
        return result;

      if(!connected) {
        struct ftp_conn *ftpc = &conn->proto.ftpc;
        infof(data, "Data conn was not available immediately\n");
        state(conn, FTP_STOP);
        ftpc->wait_data_conn = TRUE;
      }
    }
    else
      return InitiateTransfer(conn);
  }
  else {
    if((instate == FTP_LIST) && (ftpcode == 450)) {
      /* simply no matching files in the dir listing */
      ftp->transfer = FTPTRANSFER_NONE; /* don't download anything */
      state(conn, FTP_STOP); /* this phase is over */
    }
    else {
      failf(data, "RETR response: %03d", ftpcode);
      return instate == FTP_RETR && ftpcode == 550?
        CURLE_REMOTE_FILE_NOT_FOUND:
        CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  return result;
}